

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O0

allocation_result __thiscall
mjs::gc_heap::allocation_context::allocate(allocation_context *this,size_t num_bytes)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  allocation_result aVar4;
  uint32_t pos;
  uint32_t num_slots;
  size_t num_bytes_local;
  allocation_context *this_local;
  
  if ((num_bytes == 0) || (0xfffffffe < num_bytes)) {
    __assert_fail("!\"Invalid allocation size\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp"
                  ,0xa6,
                  "gc_heap::allocation_result mjs::gc_heap::allocation_context::allocate(size_t)");
  }
  uVar2 = bytes_to_slots(num_bytes);
  uVar3 = uVar2 + 1;
  if ((uVar3 <= this->capacity_) && (this->next_free_ <= this->capacity_ - uVar3)) {
    uVar1 = this->next_free_;
    this->next_free_ = this->next_free_ + uVar3;
    this->storage_[uVar1].new_position = uVar3;
    *(undefined4 *)((long)this->storage_ + (ulong)uVar1 * 8 + 4) = 0xffffffff;
    aVar4._4_4_ = 0;
    aVar4.pos = uVar1 + 1;
    aVar4.obj = this->storage_ + (uVar1 + 1);
    return aVar4;
  }
  __assert_fail("!\"Not implemented: Ran out of heap\"",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp",
                0xac,"gc_heap::allocation_result mjs::gc_heap::allocation_context::allocate(size_t)"
               );
}

Assistant:

gc_heap::allocation_result gc_heap::allocation_context::allocate(size_t num_bytes) {
    if (!num_bytes || num_bytes >= UINT32_MAX) {
        assert(!"Invalid allocation size");
        throw std::bad_alloc{};
    }

    const auto num_slots = 1 + bytes_to_slots(num_bytes);
    if (num_slots > capacity_ || next_free_ > capacity_ - num_slots) {
        assert(!"Not implemented: Ran out of heap");
        throw std::bad_alloc{};
    }
    const auto pos = next_free_;
    next_free_ += num_slots;
    storage_[pos].allocation.size = num_slots;
    storage_[pos].allocation.type = uninitialized_type_index;
    return { pos + 1, &storage_[pos + 1] };
}